

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O2

void __thiscall
priorityQueueTest_random_large_Test::TestBody(priorityQueueTest_random_large_Test *this)

{
  T *pTVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1440;
  AssertHelper local_1438;
  double num;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1428;
  double local_1420;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  Priority_queue pq;
  default_random_engine e;
  uniform_real_distribution<double> local_13c8;
  random_device rand_dev;
  
  std::random_device::random_device(&rand_dev);
  e._M_x = 0x32a;
  local_13c8._M_param._M_a._0_4_ = 0;
  local_13c8._M_param._M_a._4_4_ = 0;
  local_13c8._M_param._M_b._0_4_ = 0;
  local_13c8._M_param._M_b._4_4_ = 0x40590000;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  pq._20_8_ = 0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  pq.PriQueue.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  iVar2 = 5000000;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    num = std::uniform_real_distribution<double>::operator()(&local_13c8,&e);
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push(&std_pq,&num);
    Priority_queue::push(&pq,&num);
  }
  local_1420 = *std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  pTVar1 = Priority_queue::top(&pq);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&num,"std_pq.top()","pq.top()",local_1420,*pTVar1);
  if (num._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_1440);
    if (local_1428.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_1428.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1438,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1438,(Message *)&local_1440);
    testing::internal::AssertHelper::~AssertHelper(&local_1438);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_1440);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_1428);
    local_1440.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)std_pq.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3);
    local_1438.data_ = (AssertHelperData *)Priority_queue::size(&pq);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&num,"std_pq.size()","pq.size()",(unsigned_long *)&local_1440,
               (unsigned_long *)&local_1438);
    if (num._0_1_ == '\0') {
      testing::Message::Message((Message *)&local_1440);
      if (local_1428.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_1428.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1438,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x36,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1438,(Message *)&local_1440);
      testing::internal::AssertHelper::~AssertHelper(&local_1438);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_1440);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_1428);
  Priority_queue::~Priority_queue(&pq);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&std_pq);
  std::random_device::~random_device(&rand_dev);
  return;
}

Assistant:

TEST_F(priorityQueueTest,random_large) {
    std::random_device rand_dev;

    std::default_random_engine e(810);
    std::uniform_real_distribution<double> dis(0, 100);

    std::priority_queue<double> std_pq;
    Priority_queue pq;

    for (unsigned i = 0; i != 5000000; ++i) {
        double num = dis(e);
        std_pq.push(num);
        pq.push(num);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
}